

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char *__s1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  tuple<void_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *data;
  bool bVar8;
  
  puVar2 = UnitTest::g_allTests_abi_cxx11_;
  puVar3 = DAT_001061b0;
  if (1 < argc) {
    uVar7 = 2;
    do {
      __s1 = argv[uVar7 - 1];
      iVar5 = strcmp(__s1,"--help");
      if ((iVar5 == 0) || (((cVar1 = *__s1, cVar1 == '-' && (__s1[1] == 'h')) && (__s1[2] == '\0')))
         ) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Usage: ");
        poVar6 = std::operator<<(poVar6,*argv);
        std::operator<<(poVar6," [-h|--help] [--only <testname>] [-v|--vim]\n");
        exit(0);
      }
      iVar5 = strcmp(__s1,"--only");
      if ((iVar5 == 0) && (uVar7 < (uint)argc)) {
        _DAT_00106190 = argv[uVar7];
      }
      else {
        iVar5 = strcmp(__s1,"--vim");
        if ((iVar5 == 0) || (((cVar1 == '-' && (__s1[1] == 'v')) && (__s1[2] == '\0')))) {
          DAT_00106198 = 1;
        }
      }
      bVar8 = uVar7 != (uint)argc;
      uVar7 = uVar7 + 1;
      puVar2 = UnitTest::g_allTests_abi_cxx11_;
      puVar3 = DAT_001061b0;
    } while (bVar8);
  }
  for (; puVar4 = DAT_001061b0, puVar2 != DAT_001061b0; puVar2 = puVar2 + 5) {
    DAT_001061b0 = puVar3;
    UnitTest::UnitTester::runTestInt
              ((UnitTester *)&UnitTest::global_unit_test_object_,(TestFunction)puVar2[4],
               (char *)*puVar2);
    puVar3 = DAT_001061b0;
    DAT_001061b0 = puVar4;
  }
  DAT_001061b0 = puVar3;
  iVar5 = UnitTest::UnitTester::finalize((UnitTester *)&UnitTest::global_unit_test_object_);
  return iVar5;
}

Assistant:

static void initTest(int argc, char **argv) {  // {{{1
  for (int i = 1; i < argc; ++i) {
    if (0 == std::strcmp(argv[i], "--help") ||
        0 == std::strcmp(argv[i], "-h")) {
      std::cout << "Usage: " << argv[0] << " [-h|--help] [--only <testname>] [-v|--vim]\n";
      exit(0);
    } else if (0 == std::strcmp(argv[i], "--only") && i + 1 < argc) {
      global_unit_test_object_.only_name = argv[i + 1];
    } else if (0 == std::strcmp(argv[i], "--vim") ||
               0 == std::strcmp(argv[i], "-v")) {
      global_unit_test_object_.vim_lines = true;
    }
  }
}